

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O3

Value * __thiscall flow::IRBuilder::createSCmpNE(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  BinaryInstr<(flow::BinaryOperator)23,_(flow::LiteralType)1> *pBVar5;
  string local_78;
  Value *local_58;
  Value *local_50;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  local_58 = rhs;
  local_50 = lhs;
  if (lhs->type_ != rhs->type_) {
    __assert_fail("lhs->type() == rhs->type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x19f,
                  "Value *flow::IRBuilder::createSCmpNE(Value *, Value *, const std::string &)");
  }
  if (lhs->type_ == String) {
    lVar3 = __dynamic_cast(lhs,&Value::typeinfo,
                           &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
    if ((lVar3 == 0) ||
       (lVar4 = __dynamic_cast(rhs,&Value::typeinfo,
                               &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0
                              ), lVar4 == 0)) {
      makeName(&local_78,this,name);
      pBVar5 = insert<flow::BinaryInstr<(flow::BinaryOperator)23,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                         (this,&local_50,&local_58,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return (Value *)pBVar5;
      }
    }
    else {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,*(long *)(lVar3 + 0x48),
                 *(long *)(lVar3 + 0x50) + *(long *)(lVar3 + 0x48));
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,*(long *)(lVar4 + 0x48),
                 *(long *)(lVar4 + 0x50) + *(long *)(lVar4 + 0x48));
      plVar1 = local_48;
      if (local_78._M_string_length == local_40) {
        if (local_78._M_string_length == 0) {
          lVar3 = 0x68;
        }
        else {
          iVar2 = bcmp(local_78._M_dataplus._M_p,local_48,local_78._M_string_length);
          lVar3 = 0x18;
          if (iVar2 == 0) {
            lVar3 = 0x68;
          }
        }
      }
      else {
        lVar3 = 0x18;
      }
      pBVar5 = (BinaryInstr<(flow::BinaryOperator)23,_(flow::LiteralType)1> *)
               ((long)&(this->program_->modules_).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar3);
      if (plVar1 != local_38) {
        operator_delete(plVar1,local_38[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return (Value *)pBVar5;
      }
    }
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    return (Value *)pBVar5;
  }
  __assert_fail("lhs->type() == LiteralType::String",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x1a0,"Value *flow::IRBuilder::createSCmpNE(Value *, Value *, const std::string &)"
               );
}

Assistant:

Value* IRBuilder::createSCmpNE(Value* lhs, Value* rhs,
                               const std::string& name) {
  assert(lhs->type() == rhs->type());
  assert(lhs->type() == LiteralType::String);

  if (auto a = dynamic_cast<ConstantString*>(lhs))
    if (auto b = dynamic_cast<ConstantString*>(rhs))
      return getBoolean(a->get() != b->get());

  return insert<SCmpNEInstr>(lhs, rhs, makeName(name));
}